

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall DHUDMessage::ResetText(DHUDMessage *this,char *text)

{
  int iVar1;
  FBrokenLines *pFVar2;
  int local_3c;
  int local_2c;
  int local_1c;
  int width;
  char *text_local;
  DHUDMessage *this_local;
  
  if (this->HUDWidth == 0) {
    iVar1 = active_con_scaletext();
    if (iVar1 == 0) {
      local_1c = DCanvas::GetWidth((DCanvas *)screen);
      local_1c = local_1c / CleanXfac;
    }
    else {
      local_1c = DCanvas::GetWidth((DCanvas *)screen);
      iVar1 = active_con_scaletext();
      local_1c = local_1c / iVar1;
    }
  }
  else {
    if (this->WrapWidth == 0) {
      local_2c = this->HUDWidth;
    }
    else {
      local_2c = this->WrapWidth;
    }
    local_1c = local_2c;
  }
  if (this->Lines != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->Lines);
  }
  if ((this->NoWrap & 1U) == 0) {
    local_3c = local_1c;
  }
  else {
    local_3c = 0x7fffffff;
  }
  pFVar2 = V_BreakLines(this->Font,local_3c,(BYTE *)text,false);
  this->Lines = pFVar2;
  this->NumLines = 0;
  this->Width = 0;
  this->Height = 0;
  if (this->Lines != (FBrokenLines *)0x0) {
    while (-1 < this->Lines[this->NumLines].Width) {
      iVar1 = FFont::GetHeight(this->Font);
      this->Height = iVar1 + this->Height;
      iVar1 = MAX<int>(this->Width,this->Lines[this->NumLines].Width);
      this->Width = iVar1;
      this->NumLines = this->NumLines + 1;
    }
  }
  return;
}

Assistant:

void DHUDMessage::ResetText (const char *text)
{
	int width;

	if (HUDWidth != 0)
	{
		width = WrapWidth == 0 ? HUDWidth : WrapWidth;
	}
	else
	{
		switch (active_con_scaletext())
		{
		case 0: width = SCREENWIDTH / CleanXfac; break;
		default: width = SCREENWIDTH / active_con_scaletext(); break;
		}
	}

	if (Lines != NULL)
	{
		V_FreeBrokenLines (Lines);
	}

	Lines = V_BreakLines (Font, NoWrap ? INT_MAX : width, (BYTE *)text);

	NumLines = 0;
	Width = 0;
	Height = 0;

	if (Lines)
	{
		for (; Lines[NumLines].Width >= 0; NumLines++)
		{
			Height += Font->GetHeight ();
			Width = MAX<int> (Width, Lines[NumLines].Width);
		}
	}
}